

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O2

void ZSTD_freeCCtxContent(ZSTD_CCtx *cctx)

{
  void *ptr;
  ZSTD_customMem customMem;
  
  if (cctx == (ZSTD_CCtx *)0x0) {
    __assert_fail("cctx != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress.c"
                  ,0xaa,"void ZSTD_freeCCtxContent(ZSTD_CCtx *)");
  }
  if (cctx->staticSize == 0) {
    ZSTD_clearAllDicts(cctx);
    customMem = cctx->customMem;
    ptr = (cctx->workspace).workspace;
    (cctx->workspace).objectEnd = (void *)0x0;
    (cctx->workspace).tableEnd = (void *)0x0;
    (cctx->workspace).tableValidEnd = (void *)0x0;
    (cctx->workspace).allocStart = (void *)0x0;
    (cctx->workspace).initOnceStart = (void *)0x0;
    (cctx->workspace).allocFailed = '\0';
    *(undefined3 *)&(cctx->workspace).field_0x39 = 0;
    (cctx->workspace).workspaceOversizedDuration = 0;
    (cctx->workspace).workspace = (void *)0x0;
    (cctx->workspace).workspaceEnd = (void *)0x0;
    (cctx->workspace).phase = ZSTD_cwksp_alloc_objects;
    (cctx->workspace).isStatic = ZSTD_cwksp_dynamic_alloc;
    ZSTD_customFree(ptr,customMem);
    return;
  }
  __assert_fail("cctx->staticSize == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress.c"
                ,0xab,"void ZSTD_freeCCtxContent(ZSTD_CCtx *)");
}

Assistant:

static void ZSTD_freeCCtxContent(ZSTD_CCtx* cctx)
{
    assert(cctx != NULL);
    assert(cctx->staticSize == 0);
    ZSTD_clearAllDicts(cctx);
#ifdef ZSTD_MULTITHREAD
    ZSTDMT_freeCCtx(cctx->mtctx); cctx->mtctx = NULL;
#endif
    ZSTD_cwksp_free(&cctx->workspace, cctx->customMem);
}